

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TrackEventDescriptor::ParseFromArray
          (TrackEventDescriptor *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  bool bVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong *in_R11;
  uint *puVar17;
  pointer pTVar18;
  bool bVar19;
  ulong local_60;
  Field local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pTVar2 = (this->available_categories_).
           super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->available_categories_).
           super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar18 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**(pTVar18->super_CppMessageObj)._vptr_CppMessageObj)();
      pTVar18 = pTVar18 + 1;
    } while (pTVar18 != pTVar3);
    (this->available_categories_).
    super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    lVar5 = 7;
    if (puVar7 <= raw) goto LAB_00236f66;
    uVar13 = (ulong)(char)(byte)*raw;
    puVar9 = (ulong *)((long)raw + 1);
    if ((long)uVar13 < 0) {
      bVar1 = (byte)*raw;
      uVar4 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar14 = puVar9;
      for (; (uVar13 = uVar4, puVar11 = puVar14, (char)bVar1 < '\0' &&
             (bVar19 = 0x38 < lVar5 - 7U, bVar10 = bVar19 || puVar7 <= puVar14, uVar13 = 0,
             puVar11 = puVar9, !bVar19 && puVar7 > puVar14)); lVar5 = lVar5 + 7) {
        bVar1 = (byte)*puVar14;
        in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f));
        puVar14 = (ulong *)((long)puVar14 + 1);
        uVar4 = uVar4 | (ulong)in_R11;
      }
      puVar9 = puVar11;
      if (bVar10) {
        puVar9 = (ulong *)raw;
        uVar13 = 0;
      }
      if (puVar9 == (ulong *)raw) goto LAB_00236f66;
    }
    uVar6 = (uint)(uVar13 >> 3);
    if ((uVar6 == 0) || (puVar7 <= puVar9)) {
switchD_00236de0_caseD_3:
      bVar10 = false;
      uVar13 = 0;
      uVar4 = 0;
    }
    else {
      switch((uint)uVar13 & 7) {
      case 0:
        uVar12 = 0;
        bVar10 = puVar9 >= puVar7;
        if (puVar9 < puVar7) {
          puVar14 = (ulong *)((long)puVar9 + 1);
          bVar1 = (byte)*puVar9;
          uVar8 = (ulong)(bVar1 & 0x7f);
          uVar4 = 0;
          uVar15 = uVar8;
          if ((char)bVar1 < '\0') {
            uVar15 = 0;
          }
          uVar16 = (uint)uVar15;
          in_R11 = puVar14;
          if ((char)bVar1 < '\0') {
            uVar4 = 0;
            lVar5 = 7;
            puVar11 = puVar14;
            do {
              uVar16 = (uint)uVar15;
              bVar10 = 0x38 < lVar5 - 7U || puVar7 <= puVar11;
              in_R11 = puVar14;
              if (bVar10) break;
              bVar1 = (byte)*puVar11;
              in_R11 = (ulong *)((long)puVar11 + 1);
              uVar8 = uVar8 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
              if ((char)bVar1 >= '\0') {
                uVar15 = uVar8 & 0xffffffff;
                uVar4 = uVar8 >> 0x20;
              }
              uVar16 = (uint)uVar15;
              puVar11 = in_R11;
            } while ((char)bVar1 < '\0');
          }
        }
        else {
          uVar4 = 0;
          uVar16 = 0;
        }
        if (bVar10) {
          uVar4 = 0;
          in_R11 = puVar9;
          uVar16 = 0;
        }
        if (in_R11 != puVar9) goto LAB_00236f93;
        uVar13 = 0;
        bVar10 = false;
        uVar4 = uVar12;
        goto LAB_00236fde;
      case 1:
        in_R11 = puVar9 + 1;
        if (puVar7 < in_R11) {
LAB_00236f66:
          uVar13 = 0;
          bVar10 = false;
          uVar4 = 0;
          goto LAB_00236fde;
        }
        uVar12 = *puVar9;
        uVar4 = uVar12 >> 0x20;
        break;
      case 2:
        bVar10 = puVar9 >= puVar7;
        uVar12 = local_60;
        if (puVar9 < puVar7) {
          puVar14 = (ulong *)((long)puVar9 + 1);
          uVar4 = (ulong)((byte)*puVar9 & 0x7f);
          in_R11 = puVar14;
          uVar12 = uVar4;
          if ((char)(byte)*puVar9 < '\0') {
            lVar5 = 7;
            puVar11 = puVar14;
            do {
              bVar10 = 0x38 < lVar5 - 7U || puVar7 <= puVar11;
              in_R11 = puVar14;
              uVar12 = local_60;
              if (bVar10) break;
              uVar15 = *puVar11;
              puVar11 = (ulong *)((long)puVar11 + 1);
              uVar4 = uVar4 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
              in_R11 = puVar11;
              uVar12 = uVar4;
            } while ((char)(byte)uVar15 < '\0');
          }
        }
        uVar4 = 0;
        local_60 = uVar12;
        if (bVar10) {
          in_R11 = puVar9;
          local_60 = uVar4;
        }
        if (in_R11 == puVar9) {
          uVar16 = 0;
          bVar10 = false;
          uVar12 = 0;
        }
        else if ((ulong)((long)puVar7 - (long)in_R11) < local_60) {
          uVar4 = 0;
          uVar16 = 0;
          bVar10 = false;
          uVar12 = 0;
        }
        else {
          uVar4 = (ulong)in_R11 >> 0x20;
          uVar16 = (uint)in_R11;
          in_R11 = (ulong *)((long)in_R11 + local_60);
          bVar10 = true;
          uVar12 = local_60;
        }
        if (!bVar10) goto LAB_00236f66;
        goto LAB_00236f93;
      default:
        goto switchD_00236de0_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar9 + 4);
        uVar4 = 0;
        if (puVar7 < in_R11) goto LAB_00236f66;
        uVar12 = (ulong)(uint)*puVar9;
      }
      uVar16 = (uint)uVar12;
      uVar12 = 0;
LAB_00236f93:
      bVar10 = true;
      raw = in_R11;
      if ((uVar6 < 0x10000) && (uVar12 < 0x10000000)) {
        uVar4 = (ulong)uVar16 | uVar4 << 0x20;
        uVar13 = uVar12 | (uVar13 >> 3) << 0x20 | (uVar13 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        uVar4 = 0;
        uVar13 = 0;
      }
    }
LAB_00236fde:
    puVar17 = &switchD_00236de0::switchdataD_0034d6c0;
    local_48.int_value_ = uVar4;
    if (!bVar10) {
      do {
        local_48.size_ = (uint32_t)uVar13;
        local_48.type_ = (uint8_t)(uVar13 >> 0x30);
        local_48.id_ = (uint16_t)(uVar13 >> 0x20);
        if (local_48.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          std::
          vector<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
          ::emplace_back<>(&this->available_categories_);
          pTVar2 = (this->available_categories_).
                   super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (*pTVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                    (pTVar2 + -1,local_48.int_value_,(ulong)local_48.size_);
        }
        else {
          if (local_48.id_ == 0) {
            return puVar7 == (ulong *)raw;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_48,local_38);
        }
        do {
          if (puVar7 <= raw) goto LAB_00237195;
          uVar13 = (ulong)(char)(byte)*raw;
          puVar9 = (ulong *)((long)raw + 1);
          if ((long)uVar13 < 0) {
            uVar13 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            puVar14 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar5 = 7;
              uVar12 = uVar13;
              puVar11 = puVar9;
              do {
                bVar10 = 0x38 < lVar5 - 7U || puVar7 <= puVar11;
                uVar13 = 0;
                puVar14 = puVar9;
                if (bVar10) break;
                uVar15 = *puVar11;
                puVar14 = (ulong *)((long)puVar11 + 1);
                uVar13 = uVar12 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar5 & 0x3f);
                lVar5 = lVar5 + 7;
                uVar12 = uVar13;
                puVar11 = puVar14;
              } while ((char)(byte)uVar15 < '\0');
            }
            puVar9 = puVar14;
            if (bVar10) {
              puVar9 = (ulong *)raw;
              uVar13 = 0;
            }
            if (puVar9 == (ulong *)raw) goto LAB_00237195;
          }
          uVar6 = (uint)(uVar13 >> 3);
          if ((uVar6 == 0) || (puVar7 <= puVar9)) {
switchD_0023721b_caseD_3:
            local_48.int_value_ = 0;
            bVar10 = false;
            uVar13 = 0;
            goto LAB_00237411;
          }
          switch((uint)uVar13 & 7) {
          case 0:
            local_48.int_value_ = 0;
            bVar10 = puVar9 >= puVar7;
            if (puVar9 < puVar7) {
              puVar14 = (ulong *)((long)puVar9 + 1);
              uVar16 = (byte)*puVar9 & 0x7f;
              uVar12 = (ulong)uVar16;
              uVar15 = (ulong)uVar16;
              puVar17 = (uint *)puVar14;
              uVar16 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                uVar15 = 0;
                lVar5 = 7;
                puVar11 = puVar14;
                do {
                  bVar19 = 0x38 < lVar5 - 7U;
                  bVar10 = bVar19 || puVar7 <= puVar11;
                  puVar17 = (uint *)puVar14;
                  uVar16 = 0;
                  if (bVar19 || puVar7 <= puVar11) break;
                  bVar1 = (byte)*puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar12 = uVar12 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  if (-1 < (char)bVar1) {
                    uVar15 = uVar12 & 0xffffffff;
                  }
                  puVar17 = (uint *)puVar11;
                  uVar16 = (uint)(uVar12 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar15 = 0;
              uVar16 = 0;
            }
            if (bVar10) {
              uVar15 = local_48.int_value_;
            }
            uVar12 = (ulong)uVar16;
            if (bVar10) {
              puVar17 = (uint *)puVar9;
              uVar12 = local_48.int_value_;
            }
            uVar8 = local_48.int_value_;
            if ((ulong *)puVar17 == puVar9) {
              uVar13 = 0;
              bVar10 = false;
            }
            else {
LAB_002373c6:
              raw = puVar17;
              bVar10 = true;
              puVar17 = (uint *)raw;
              if ((uVar6 < 0x10000) && (uVar8 < 0x10000000)) {
                local_48.int_value_ = uVar15 & 0xffffffff | uVar12 << 0x20;
                uVar13 = uVar8 | (uVar13 >> 3) << 0x20 | (uVar13 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_48.int_value_ = 0;
                uVar13 = 0;
              }
            }
            break;
          case 1:
            puVar17 = (uint *)(puVar9 + 1);
            if (puVar17 <= puVar7) {
              uVar15 = *puVar9;
              uVar12 = uVar15 >> 0x20;
LAB_0023727c:
              uVar8 = 0;
              goto LAB_002373c6;
            }
            goto LAB_00237195;
          case 2:
            bVar10 = puVar9 >= puVar7;
            uVar12 = uVar4;
            if (puVar9 < puVar7) {
              puVar14 = (ulong *)((long)puVar9 + 1);
              uVar15 = (ulong)((byte)*puVar9 & 0x7f);
              puVar17 = (uint *)puVar14;
              uVar12 = uVar15;
              if ((char)(byte)*puVar9 < '\0') {
                lVar5 = 7;
                puVar11 = puVar14;
                do {
                  bVar10 = 0x38 < lVar5 - 7U || puVar7 <= puVar11;
                  puVar17 = (uint *)puVar14;
                  uVar12 = uVar4;
                  if (bVar10) break;
                  uVar8 = *puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar15 = uVar15 | (ulong)((byte)uVar8 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  puVar17 = (uint *)puVar11;
                  uVar12 = uVar15;
                } while ((char)(byte)uVar8 < '\0');
              }
            }
            uVar4 = uVar12;
            if (bVar10) {
              puVar17 = (uint *)puVar9;
              uVar4 = 0;
            }
            if (((ulong *)puVar17 == puVar9) || ((ulong)((long)puVar7 - (long)puVar17) < uVar4)) {
              uVar15 = 0;
              uVar12 = 0;
              bVar10 = false;
              uVar8 = 0;
            }
            else {
              uVar12 = (ulong)puVar17 >> 0x20;
              uVar15 = (ulong)puVar17 & 0xffffffff;
              puVar17 = (uint *)((long)puVar17 + uVar4);
              bVar10 = true;
              uVar8 = uVar4;
            }
            if (bVar10) goto LAB_002373c6;
            local_48.int_value_ = 0;
            uVar13 = 0;
            bVar10 = false;
            break;
          default:
            goto switchD_0023721b_caseD_3;
          case 5:
            puVar17 = (uint *)((long)puVar9 + 4);
            uVar12 = 0;
            if (puVar17 <= puVar7) {
              uVar15 = (ulong)(uint)*puVar9;
              goto LAB_0023727c;
            }
LAB_00237195:
            local_48.int_value_ = 0;
            uVar13 = 0;
            bVar10 = false;
          }
LAB_00237411:
        } while (bVar10);
      } while( true );
    }
  } while( true );
}

Assistant:

bool TrackEventDescriptor::ParseFromArray(const void* raw, size_t size) {
  available_categories_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* available_categories */:
        available_categories_.emplace_back();
        available_categories_.back().ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}